

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::TOIFactoredRewardDecPOMDPDiscrete
          (TOIFactoredRewardDecPOMDPDiscrete *this,TOIFactoredRewardDecPOMDPDiscrete *o)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  pointer_____offset_0x60___ *pf;
  string *descr;
  E *this_00;
  void **in_stack_ffffffffffffff68;
  TOIDecPOMDPDiscrete *in_stack_ffffffffffffff70;
  allocator<char> local_69;
  string local_68 [55];
  undefined1 local_31 [49];
  
  descr = (string *)(in_RDI + 0x5b);
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)descr);
  pf = &VTT;
  POSGInterface::POSGInterface((POSGInterface *)descr,&PTR_PTR_00d3bba0);
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)descr,(void **)((long)pf + 0xe0));
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)(in_RDI + 0x5c),
             (void **)&((string *)((long)pf + 0x100))->_M_string_length);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)descr,
             (void **)((long)&((string *)((long)pf + 0xa0))->field_2 + 8));
  this_00 = (E *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,(allocator<char> *)this_00)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,(allocator<char> *)this_00)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,(allocator<char> *)this_00)
  ;
  TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(string *)this_00,descr,
             (string *)pf,SUB81((ulong)in_RDI >> 0x38,0));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  *in_RDI = 0xd3b2f8;
  in_RDI[0x5b] = 0xd3b6d8;
  in_RDI[0x5b] = 0xd3b6d8;
  in_RDI[0x5b] = 0xd3b6d8;
  in_RDI[0x5b] = 0xd3b6d8;
  in_RDI[0x5c] = 0xd3b930;
  in_RDI[0x50] = 0xd3b550;
  std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::vector
            ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)0xac8bde);
  uVar1 = __cxa_allocate_exception(0x28);
  E::E(this_00,(char *)descr);
  __cxa_throw(uVar1,&E::typeinfo,E::~E);
}

Assistant:

TOIFactoredRewardDecPOMDPDiscrete::
TOIFactoredRewardDecPOMDPDiscrete(const TOIFactoredRewardDecPOMDPDiscrete& o) 
{
    throw(E("TOIFactoredRewardDecPOMDPDiscrete: copy ctor not yet implemented"));
}